

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O3

string_t __thiscall
duckdb::TrimOperator<true,false>::Operation<duckdb::string_t,duckdb::string_t>
          (TrimOperator<true,false> *this,string_t input,Vector *result)

{
  utf8proc_category_t uVar1;
  utf8proc_ssize_t uVar2;
  StringVector *extraout_RDX;
  StringVector *len;
  long lVar3;
  ulong uVar4;
  undefined1 *__dest;
  ulong uVar5;
  string_t sVar6;
  utf8proc_int32_t codepoint;
  string_t target;
  utf8proc_int32_t local_54;
  undefined1 local_50 [16];
  undefined8 local_40;
  long local_38;
  
  local_38 = input.value._0_8_;
  lVar3 = local_38;
  if ((uint)this < 0xd) {
    lVar3 = (long)&local_40 + 4;
  }
  uVar5 = (ulong)this & 0xffffffff;
  uVar4 = 0;
  len = input.value._8_8_;
  local_40 = this;
  if ((uint)this != 0) {
    do {
      uVar2 = utf8proc_iterate((utf8proc_uint8_t *)(lVar3 + uVar4),uVar5 - uVar4,&local_54);
      uVar1 = utf8proc_category(local_54);
      len = extraout_RDX;
      if (uVar1 != UTF8PROC_CATEGORY_ZS) break;
      uVar4 = uVar4 + uVar2;
    } while (uVar4 < uVar5);
  }
  local_50 = (undefined1  [16])
             StringVector::EmptyString(input.value._8_8_,(Vector *)(uVar5 - uVar4),(idx_t)len);
  __dest = local_50._8_8_;
  if (local_50._0_4_ < 0xd) {
    __dest = local_50 + 4;
  }
  switchD_00b041bd::default(__dest,(void *)(lVar3 + uVar4),(size_t)(uVar5 - uVar4));
  uVar4 = (ulong)(uint)local_50._0_4_;
  if (uVar4 < 0xd) {
    switchD_00569a20::default(local_50 + 4 + uVar4,0,0xc - uVar4);
  }
  else {
    local_50._4_4_ = *(undefined4 *)local_50._8_8_;
  }
  sVar6.value.pointer.ptr = (char *)local_50._8_8_;
  sVar6.value._0_8_ = local_50._0_8_;
  return (string_t)sVar6.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		utf8proc_int32_t codepoint;
		auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		// Find the first character that is not left trimmed
		idx_t begin = 0;
		if (LTRIM) {
			while (begin < size) {
				auto bytes =
				    utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				D_ASSERT(bytes > 0);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					break;
				}
				begin += UnsafeNumericCast<idx_t>(bytes);
			}
		}

		// Find the last character that is not right trimmed
		idx_t end;
		if (RTRIM) {
			end = begin;
			for (auto next = begin; next < size;) {
				auto bytes = utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				D_ASSERT(bytes > 0);
				next += UnsafeNumericCast<idx_t>(bytes);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					end = next;
				}
			}
		} else {
			end = size;
		}

		// Copy the trimmed string
		auto target = StringVector::EmptyString(result, end - begin);
		auto output = target.GetDataWriteable();
		memcpy(output, data + begin, end - begin);

		target.Finalize();
		return target;
	}